

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O3

void __thiscall rcg::Device::abortWaitingForModuleEvents(Device *this)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  
  __mutex = &this->mtx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if (this->event != (EVENT_HANDLE)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->EventKill)(this->event);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void Device::abortWaitingForModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (event != 0)
  {
    gentl->EventKill(event);
  }
}